

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

string * efsw::Errors::Log::getLastErrorLog_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)LastError_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string Log::getLastErrorLog() {
	return LastError;
}